

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

err_t Node_Toggle(void *Node,dataid Id)

{
  err_t eVar1;
  long local_20;
  bool_t Bool;
  dataid Id_local;
  void *Node_local;
  
  local_20 = 0;
  Bool = Id;
  Id_local = (dataid)Node;
  if (Node == (void *)0x0) {
    __assert_fail("(const void*)(Node)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0xa9f,"err_t Node_Toggle(void *, dataid)");
  }
  (**(code **)(*(long *)((long)Node + 8) + 0x18))(Node,Id,&local_20,8);
  local_20 = (long)(int)(uint)((local_20 != 0 ^ 0xffU) & 1);
  if (Id_local != 0) {
    eVar1 = (**(code **)(*(long *)(Id_local + 8) + 0x20))(Id_local,Bool,&local_20,8);
    return eVar1;
  }
  __assert_fail("(const void*)(Node)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                ,0xaa1,"err_t Node_Toggle(void *, dataid)");
}

Assistant:

err_t Node_Toggle(void* Node,dataid Id)
{
    bool_t Bool = 0;
    Node_GET(Node,Id,&Bool);
    Bool = !Bool;
    return Node_SET(Node,Id,&Bool);
}